

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3LookasideUsed(sqlite3 *db,int *pHighwater)

{
  int iVar1;
  int iVar2;
  LookasideSlot *pLVar3;
  
  pLVar3 = (db->lookaside).pInit;
  iVar1 = 0;
  iVar2 = 0;
  if (pLVar3 != (LookasideSlot *)0x0) {
    iVar2 = 0;
    do {
      pLVar3 = pLVar3->pNext;
      iVar2 = iVar2 + 1;
    } while (pLVar3 != (LookasideSlot *)0x0);
  }
  pLVar3 = (db->lookaside).pFree;
  if (pLVar3 != (LookasideSlot *)0x0) {
    iVar1 = 0;
    do {
      pLVar3 = pLVar3->pNext;
      iVar1 = iVar1 + -1;
    } while (pLVar3 != (LookasideSlot *)0x0);
  }
  if (pHighwater != (int *)0x0) {
    *pHighwater = (db->lookaside).nSlot - iVar2;
  }
  return (iVar1 - iVar2) + (db->lookaside).nSlot;
}

Assistant:

SQLITE_PRIVATE int sqlite3LookasideUsed(sqlite3 *db, int *pHighwater){
  u32 nInit = countLookasideSlots(db->lookaside.pInit);
  u32 nFree = countLookasideSlots(db->lookaside.pFree);
  if( pHighwater ) *pHighwater = db->lookaside.nSlot - nInit;
  return db->lookaside.nSlot - (nInit+nFree);
}